

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O0

int t1_init_ctxno_sc(int f)

{
  OPJ_INT32 OVar1;
  OPJ_INT32 OVar2;
  uint local_18;
  int local_14;
  int n;
  int vc;
  int hc;
  int f_local;
  
  local_18 = 0;
  OVar1 = opj_int_min((uint)((f & 0x220U) == 0x20) + (uint)((f & 0x880U) == 0x80),1);
  OVar2 = opj_int_min((uint)((f & 0x220U) == 0x220) + (uint)((f & 0x880U) == 0x880),1);
  n = OVar1 - OVar2;
  OVar1 = opj_int_min((uint)((f & 0x110U) == 0x10) + (uint)((f & 0x440U) == 0x40),1);
  OVar2 = opj_int_min((uint)((f & 0x110U) == 0x110) + (uint)((f & 0x440U) == 0x440),1);
  local_14 = OVar1 - OVar2;
  if (n < 0) {
    n = -n;
    local_14 = -local_14;
  }
  if (n == 0) {
    if (local_14 == -1) {
      local_18 = 1;
    }
    else {
      local_18 = (uint)(local_14 != 0);
    }
  }
  else if (n == 1) {
    if (local_14 == -1) {
      local_18 = 2;
    }
    else if (local_14 == 0) {
      local_18 = 3;
    }
    else {
      local_18 = 4;
    }
  }
  return local_18 + 9;
}

Assistant:

static int t1_init_ctxno_sc(int f) {
	int hc, vc, n;
	n = 0;

	hc = opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
				T1_SIG_E) + ((f & (T1_SIG_W | T1_SGN_W)) == T1_SIG_W),
			1) - opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
					(T1_SIG_E | T1_SGN_E)) +
				((f & (T1_SIG_W | T1_SGN_W)) ==
				 (T1_SIG_W | T1_SGN_W)), 1);

	vc = opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
				T1_SIG_N) + ((f & (T1_SIG_S | T1_SGN_S)) == T1_SIG_S),
			1) - opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
					(T1_SIG_N | T1_SGN_N)) +
				((f & (T1_SIG_S | T1_SGN_S)) ==
				 (T1_SIG_S | T1_SGN_S)), 1);

	if (hc < 0) {
		hc = -hc;
		vc = -vc;
	}
	if (!hc) {
		if (vc == -1)
			n = 1;
		else if (!vc)
			n = 0;
		else
			n = 1;
	} else if (hc == 1) {
		if (vc == -1)
			n = 2;
		else if (!vc)
			n = 3;
		else
			n = 4;
	}

	return (T1_CTXNO_SC + n);
}